

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
JsUtil::List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
EnsureArray(List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *this,int32 requiredCapacity)

{
  int left;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  Probe **src;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Probe **dst;
  Type ppPVar6;
  size_t sVar7;
  int32 local_3c;
  int32 local_38;
  int32 newBufferSize;
  int32 oldBufferSize;
  int32 newLength;
  
  if ((this->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer ==
      (Type)0x0) {
    if (requiredCapacity < this->increment) {
      requiredCapacity = this->increment;
    }
    if (requiredCapacity == 0) {
      ppPVar6 = (Type)&DAT_00000008;
    }
    else {
      pAVar1 = &((this->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                alloc)->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      sVar7 = 0xffffffffffffffff;
      if (-1 < requiredCapacity) {
        sVar7 = (ulong)(uint)requiredCapacity << 3;
      }
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_008c962a;
        *puVar5 = 0;
      }
      ppPVar6 = (Type)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      AllocInternal(pAVar1,sVar7);
      if (ppPVar6 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_008c962a;
        *puVar5 = 0;
        ppPVar6 = (Type)0x0;
      }
    }
    (this->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
         ppPVar6;
    (this->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
    this->length = requiredCapacity;
    return;
  }
  left = this->length;
  if ((this->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count != left
      && requiredCapacity <= left) {
    return;
  }
  newBufferSize = 0;
  local_3c = 0;
  local_38 = 0;
  bVar3 = Int32Math::Add(left,1,&newBufferSize);
  if ((bVar3) || (bVar3 = Int32Math::Shl(newBufferSize,1,&newBufferSize), bVar3)) {
    ExternalApi::RaiseOnIntOverflow();
  }
  if (requiredCapacity < newBufferSize) {
    requiredCapacity = newBufferSize;
  }
  newBufferSize = requiredCapacity;
  bVar3 = Int32Math::Mul(8,requiredCapacity,&local_3c);
  if ((bVar3) || (bVar3 = Int32Math::Mul(8,this->length,&local_38), bVar3)) {
    ExternalApi::RaiseOnIntOverflow();
  }
  if ((ulong)(uint)newBufferSize == 0) {
    dst = (Probe **)&DAT_00000008;
  }
  else {
    pAVar1 = &((this->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              alloc)->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    sVar7 = 0xffffffffffffffff;
    if (-1 < newBufferSize) {
      sVar7 = (ulong)(uint)newBufferSize << 3;
    }
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_008c962a;
      *puVar5 = 0;
    }
    dst = (Probe **)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    (pAVar1,sVar7);
    if (dst == (Probe **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_008c962a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      dst = (Probe **)0x0;
    }
  }
  src = (this->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer;
  Memory::CopyArray<Js::Probe*,Js::Probe*,Memory::ArenaAllocator>
            (dst,(long)newBufferSize,src,(long)this->length);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&((this->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              alloc)->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,src,
             (long)local_38);
  this->length = newBufferSize;
  (this->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer = dst;
  return;
}

Assistant:

void EnsureArray(DECLSPEC_GUARD_OVERFLOW int32 requiredCapacity)
        {
            if (this->buffer == nullptr)
            {
                int32 newSize = max(requiredCapacity, increment);

                this->buffer = AllocArray(newSize);
                this->count = 0;
                this->length = newSize;
            }
            else if (this->count == length || requiredCapacity > this->length)
            {
                int32 newLength = 0, newBufferSize = 0, oldBufferSize = 0;

                if (Int32Math::Add(length, 1u, &newLength)
                    || Int32Math::Shl(newLength, 1u, &newLength))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                newLength = max(requiredCapacity, newLength);

                if (Int32Math::Mul(sizeof(T), newLength, &newBufferSize)
                    || Int32Math::Mul(sizeof(T), length, &oldBufferSize))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                Field(T, TAllocator)* newbuffer = AllocArray(newLength);
                Field(T, TAllocator)* oldbuffer = this->buffer;
                CopyArray<Field(T, TAllocator), Field(T, TAllocator), EffectiveAllocatorType>(
                    newbuffer, newLength, oldbuffer, length);

                FreeArray(oldbuffer, oldBufferSize);

                this->length = newLength;
                this->buffer = newbuffer;
            }
        }